

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsproxywidget.cpp
# Opt level: O1

void __thiscall
QGraphicsProxyWidget::resizeEvent(QGraphicsProxyWidget *this,QGraphicsSceneResizeEvent *event)

{
  long lVar1;
  long lVar2;
  undefined4 extraout_EAX;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  QWidget *this_00;
  long in_FS_OFFSET;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  QSizeF QVar8;
  QSize local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 0x18);
  lVar2 = *(long *)(lVar1 + 0x208);
  if ((((lVar2 != 0) && (*(int *)(lVar2 + 4) != 0)) && (*(long *)(lVar1 + 0x210) != 0)) &&
     ((*(ushort *)(lVar1 + 0x244) & 0xc) != 8)) {
    if ((lVar2 == 0) || (*(int *)(lVar2 + 4) == 0)) {
      this_00 = (QWidget *)0x0;
    }
    else {
      this_00 = *(QWidget **)(lVar1 + 0x210);
    }
    QVar8 = QGraphicsSceneResizeEvent::newSize(event);
    auVar7._0_8_ = (double)((ulong)QVar8.ht & 0x8000000000000000 | 0x3fe0000000000000) + QVar8.ht;
    auVar7._8_8_ = (double)((ulong)QVar8.wd & 0x8000000000000000 | 0x3fe0000000000000) + QVar8.wd;
    auVar7 = minpd(_DAT_0066f5d0,auVar7);
    auVar6._8_8_ = -(ulong)(-2147483648.0 < auVar7._8_8_);
    auVar6._0_8_ = -(ulong)(-2147483648.0 < auVar7._0_8_);
    uVar3 = movmskpd(extraout_EAX,auVar6);
    uVar5 = 0x8000000000000000;
    if ((uVar3 & 1) != 0) {
      uVar5 = (ulong)(uint)(int)auVar7._0_8_ << 0x20;
    }
    uVar4 = 0x80000000;
    if ((uVar3 & 2) != 0) {
      uVar4 = (ulong)(uint)(int)auVar7._8_8_;
    }
    local_28 = (QSize)(uVar4 | uVar5);
    QWidget::resize(this_00,&local_28);
  }
  QGraphicsWidget::resizeEvent((QGraphicsWidget *)this,event);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsProxyWidget::resizeEvent(QGraphicsSceneResizeEvent *event)
{
    Q_D(QGraphicsProxyWidget);
    if (d->widget) {
        if (d->sizeChangeMode != QGraphicsProxyWidgetPrivate::WidgetToProxyMode)
            d->widget->resize(event->newSize().toSize());
    }
    QGraphicsWidget::resizeEvent(event);
}